

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetScrollFromPosY(ImGuiWindow *window,float param_2,float center_y_ratio)

{
  float fVar1;
  float fVar2;
  
  if ((0.0 <= center_y_ratio) && (center_y_ratio <= 1.0)) {
    fVar1 = ImGuiWindow::TitleBarHeight(window);
    fVar2 = ImGuiWindow::MenuBarHeight(window);
    (window->ScrollTarget).y = (float)(int)((param_2 - (fVar2 + fVar1)) + (window->Scroll).y);
    (window->ScrollTargetCenterRatio).y = center_y_ratio;
    (window->ScrollTargetEdgeSnapDist).y = 0.0;
    return;
  }
  __assert_fail("center_y_ratio >= 0.0f && center_y_ratio <= 1.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x2531,"void ImGui::SetScrollFromPosY(ImGuiWindow *, float, float)");
}

Assistant:

void ImGui::SetScrollFromPosY(ImGuiWindow* window, float local_y, float center_y_ratio)
{
    IM_ASSERT(center_y_ratio >= 0.0f && center_y_ratio <= 1.0f);
    const float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight(); // FIXME: Would be nice to have a more standardized access to our scrollable/client rect;
    local_y -= decoration_up_height;
    window->ScrollTarget.y = IM_FLOOR(local_y + window->Scroll.y); // Convert local position to scroll offset
    window->ScrollTargetCenterRatio.y = center_y_ratio;
    window->ScrollTargetEdgeSnapDist.y = 0.0f;
}